

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_unexpectedCallHappened_Test::testBody
          (TEST_MockCallTest_unexpectedCallHappened_Test *this)

{
  UtestShell *test;
  MockSupport *pMVar1;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  undefined1 local_a0 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest emptyExpectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_unexpectedCallHappened_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&emptyExpectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b0,"func");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_a0,test,&local_b0,
             (MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::SimpleString(&local_c0,"");
  pMVar1 = mock(&local_c0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_d0,"func");
  (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_d0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x7e);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_a0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&emptyExpectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, unexpectedCallHappened)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "func", emptyExpectations);

    mock().actualCall("func");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}